

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

PacketBuilder * __thiscall
PacketBuilder::AddBreakString(PacketBuilder *this,string *str,uchar breakchar)

{
  pointer pcVar1;
  long lVar2;
  string tempstr;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + str->_M_string_length);
  lVar2 = std::__cxx11::string::find((char)(string *)local_40,(ulong)(uint)(int)(char)breakchar);
  if (lVar2 != -1) {
    do {
      *(undefined1 *)((long)local_40[0] + lVar2) = 0x79;
      lVar2 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)(char)breakchar);
    } while (lVar2 != -1);
  }
  std::__cxx11::string::_M_append((char *)&this->data,(ulong)local_40[0]);
  std::__cxx11::string::push_back((char)&this->data);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddBreakString(const std::string &str, unsigned char breakchar)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	std::string tempstr(str);
	std::size_t breakin = tempstr.find_first_of(breakchar);

	while (breakin != std::string::npos)
	{
		tempstr[breakin] = 'y';
		breakin = tempstr.find_first_of(breakchar, breakin+1);
	}

	this->data += tempstr;
	this->data += breakchar;


#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}